

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O3

int func(int *data,int head,int tail,int key)

{
  int iVar1;
  int iVar2;
  
  if (head <= tail) {
    iVar1 = tail + head;
    do {
      while( true ) {
        iVar2 = iVar1 / 2;
        if (data[iVar2] == key) {
          return iVar2;
        }
        if (data[iVar2] <= key) break;
        tail = iVar2 + -1;
        iVar1 = iVar2 + head + -1;
        if (iVar2 <= head) {
          return -1;
        }
      }
      head = iVar2 + 1;
      iVar1 = tail + iVar2 + 1;
    } while (iVar2 < tail);
  }
  return -1;
}

Assistant:

int func(int data[], int head, int tail, int key) {
  int center = (head + tail) / 2;

  if (head > tail) {
    return -1;
  }

  else if (data[center] == key) {
    return center;
  }

  else if (data[center] > key) {
    return func(data, head, center - 1, key);
  }

  else {
    return func(data, center + 1, tail, key);
  }
}